

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-table.c
# Opt level: O2

_Bool Curl_uint_tbl_first(uint_tbl *tbl,uint *pkey,void **pentry)

{
  _Bool _Var1;
  
  if (pentry == (void **)0x0 || pkey == (uint *)0x0) {
    return false;
  }
  if ((tbl->nentries != 0) && (_Var1 = uint_tbl_next_at(tbl,0,pkey,pentry), _Var1)) {
    return true;
  }
  *pkey = 0xffffffff;
  *pentry = (void *)0x0;
  return false;
}

Assistant:

bool Curl_uint_tbl_first(struct uint_tbl *tbl,
                         unsigned int *pkey, void **pentry)
{
  if(!pkey || !pentry)
    return FALSE;
  if(tbl->nentries && uint_tbl_next_at(tbl, 0, pkey, pentry))
    return TRUE;
  DEBUGASSERT(!tbl->nentries);
  *pkey = UINT_MAX;  /* always invalid */
  *pentry = NULL;
  return FALSE;
}